

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algebraic_simplification.hpp
# Opt level: O3

uint32_t __thiscall
optimization::algebraic_simplification::AlgebraicSimplification::getNewVar
          (AlgebraicSimplification *this,MirFunction *func)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_node_base *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Rb_tree_color _Var3;
  uint32_t uVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  pair<unsigned_int,_mir::inst::Variable> local_48;
  
  p_Var2 = (func->variables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(func->variables)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 == p_Var1) {
    uVar4 = 2;
  }
  else {
    _Var3 = _S_black;
    do {
      if (_Var3 < p_Var2[1]._M_color) {
        _Var3 = p_Var2[1]._M_color;
      }
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var1);
    uVar4 = _Var3 + _S_black;
  }
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  this_00->_M_use_count = 1;
  this_00->_M_weak_count = 1;
  this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001eb880;
  this_00[1]._vptr__Sp_counted_base = (_func_int **)&PTR_display_001ecd58;
  local_48.second.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(this_00 + 1);
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_00->_M_use_count = 2;
  }
  local_48.second.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ecf68;
  local_48.second.is_memory_var = false;
  local_48.second.is_temp_var = true;
  local_48.second.is_phi_var = false;
  local_48.second._27_1_ = 0;
  local_48.second.priority = 0;
  local_48.first = uVar4;
  local_48.second.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = this_00;
  std::
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,mir::inst::Variable>,std::_Select1st<std::pair<unsigned_int_const,mir::inst::Variable>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,mir::inst::Variable>>>
  ::_M_emplace_unique<std::pair<unsigned_int,mir::inst::Variable>>
            ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,mir::inst::Variable>,std::_Select1st<std::pair<unsigned_int_const,mir::inst::Variable>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,mir::inst::Variable>>>
              *)&func->variables,&local_48);
  local_48.second.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ecf68;
  if (local_48.second.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.second.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  return uVar4;
}

Assistant:

uint32_t getNewVar(mir::inst::MirFunction& func) {
    uint32_t maxId = 1;
    for (auto& var : func.variables) {
      if (var.first > maxId) {
        maxId = var.first;
      }
    }
    func.variables.insert(std::pair<uint32_t, mir::inst::Variable>(
        ++maxId, mir::inst::Variable(mir::types::SharedTyPtr(
                                         std::make_shared<mir::types::IntTy>()),
                                     false, true)));
    return maxId;
  }